

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMappedVector.hpp
# Opt level: O2

BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
* __thiscall
gmlc::containers::
StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
::find(BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
       *__return_storage_ptr__,
      StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
      *this,string_view searchValue)

{
  const_iterator cVar1;
  ptrdiff_t local_50;
  key_type local_48;
  const_iterator local_38;
  
  local_48._M_str = searchValue._M_str;
  local_48._M_len = searchValue._M_len;
  cVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->lookup)._M_h,&local_48);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::end(__return_storage_ptr__,&this->dataStorage);
  }
  else {
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::begin(&local_38,&this->dataStorage);
    local_50 = *(ptrdiff_t *)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                       ._M_cur + 0x18);
    __return_storage_ptr__->offset = local_38.offset;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_38._20_4_;
    __return_storage_ptr__->vec = local_38.vec;
    __return_storage_ptr__->ptr = local_38.ptr;
    BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
    ::operator+=(__return_storage_ptr__,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(std::string_view searchValue) const
        {
            auto fnd = lookup.find(searchValue);
            if (fnd != lookup.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }